

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *jp2,OPJ_BYTE *p_cmap_header_data,OPJ_UINT32 p_cmap_header_size
                          ,opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *p_buffer;
  byte bVar1;
  opj_jp2_pclr_t *poVar2;
  opj_jp2_cmap_comp_t *poVar3;
  char *fmt;
  long lVar4;
  OPJ_UINT32 l_value;
  opj_jp2_t *local_40;
  OPJ_BYTE *local_38;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x4fd,
                  "OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_cmap_header_data != (OPJ_BYTE *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x4ff,
                    "OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    poVar2 = (jp2->color).jp2_pclr;
    if (poVar2 == (opj_jp2_pclr_t *)0x0) {
      fmt = "Need to read a PCLR box before the CMAP box.\n";
    }
    else if (poVar2->cmap == (opj_jp2_cmap_comp_t *)0x0) {
      bVar1 = poVar2->nr_channels;
      if ((uint)bVar1 * 4 <= p_cmap_header_size) {
        poVar3 = (opj_jp2_cmap_comp_t *)opj_malloc((ulong)((uint)bVar1 * 4));
        if (poVar3 != (opj_jp2_cmap_comp_t *)0x0) {
          local_40 = jp2;
          local_38 = p_cmap_header_data;
          for (lVar4 = 0; (ulong)bVar1 << 2 != lVar4; lVar4 = lVar4 + 4) {
            p_buffer = local_38 + lVar4;
            opj_read_bytes_LE(p_buffer,&l_value,2);
            *(undefined2 *)((long)&poVar3->cmp + lVar4) = (undefined2)l_value;
            opj_read_bytes_LE(p_buffer + 2,&l_value,1);
            (&poVar3->mtyp)[lVar4] = (OPJ_BYTE)l_value;
            opj_read_bytes_LE(p_buffer + 3,&l_value,1);
            (&poVar3->pcol)[lVar4] = (OPJ_BYTE)l_value;
          }
          ((local_40->color).jp2_pclr)->cmap = poVar3;
          return 1;
        }
        return 0;
      }
      fmt = "Insufficient data for CMAP box.\n";
    }
    else {
      fmt = "Only one CMAP box is allowed.\n";
    }
    opj_event_msg(p_manager,1,fmt);
    return 0;
  }
  __assert_fail("p_cmap_header_data != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x4fe,
                "OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t * jp2,
                                  OPJ_BYTE * p_cmap_header_data,
                                  OPJ_UINT32 p_cmap_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_cmap_comp_t *cmap;
    OPJ_BYTE i, nr_channels;
    OPJ_UINT32 l_value;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_cmap_header_data != 00);
    assert(p_manager != 00);
    (void)p_cmap_header_size;

    /* Need nr_channels: */
    if (jp2->color.jp2_pclr == NULL) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Need to read a PCLR box before the CMAP box.\n");
        return OPJ_FALSE;
    }

    /* Part 1, I.5.3.5: 'There shall be at most one Component Mapping box
     * inside a JP2 Header box' :
    */
    if (jp2->color.jp2_pclr->cmap) {
        opj_event_msg(p_manager, EVT_ERROR, "Only one CMAP box is allowed.\n");
        return OPJ_FALSE;
    }

    nr_channels = jp2->color.jp2_pclr->nr_channels;
    if (p_cmap_header_size < (OPJ_UINT32)nr_channels * 4) {
        opj_event_msg(p_manager, EVT_ERROR, "Insufficient data for CMAP box.\n");
        return OPJ_FALSE;
    }

    cmap = (opj_jp2_cmap_comp_t*) opj_malloc(nr_channels * sizeof(
                opj_jp2_cmap_comp_t));
    if (!cmap) {
        return OPJ_FALSE;
    }


    for (i = 0; i < nr_channels; ++i) {
        opj_read_bytes(p_cmap_header_data, &l_value, 2);            /* CMP^i */
        p_cmap_header_data += 2;
        cmap[i].cmp = (OPJ_UINT16) l_value;

        opj_read_bytes(p_cmap_header_data, &l_value, 1);            /* MTYP^i */
        ++p_cmap_header_data;
        cmap[i].mtyp = (OPJ_BYTE) l_value;

        opj_read_bytes(p_cmap_header_data, &l_value, 1);            /* PCOL^i */
        ++p_cmap_header_data;
        cmap[i].pcol = (OPJ_BYTE) l_value;
    }

    jp2->color.jp2_pclr->cmap = cmap;

    return OPJ_TRUE;
}